

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pesPacket.h
# Opt level: O2

int64_t get_pts(uint8_t *p)

{
  return (ulong)((ushort)(*(ushort *)(p + 3) << 8 | *(ushort *)(p + 3) >> 8) >> 1) |
         (ulong)((p[2] & 0xfe) << 0xe | (uint)p[1] << 0x16) | (ulong)(*p >> 1 & 7) << 0x1e;
}

Assistant:

static int64_t get_pts(const uint8_t *p)
{
    auto pts = static_cast<int64_t>((p[0] >> 1) & 0x07) << 30;
    int val = p[1] << 8 | p[2];
    pts |= (val >> 1) << 15;
    val = p[3] << 8 | p[4];
    pts |= val >> 1;
    return pts;
}